

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

void __thiscall
FIX::SocketMonitor::processWrite(SocketMonitor *this,Strategy *strategy,socket_handle socket_fd)

{
  bool bVar1;
  _Self local_30;
  _Self local_28;
  uint local_20;
  socket_handle local_1c;
  socket_handle s;
  socket_handle socket_fd_local;
  Strategy *strategy_local;
  SocketMonitor *this_local;
  
  local_20 = socket_fd;
  local_1c = socket_fd;
  _s = strategy;
  strategy_local = (Strategy *)this;
  local_28._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::find
                 (&this->m_connectSockets,(key_type *)&local_20);
  local_30._M_node =
       (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(&this->m_connectSockets);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::erase
              (&this->m_connectSockets,(key_type *)&local_20);
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              (&this->m_readSockets,(value_type_conflict1 *)&local_20);
    (*_s->_vptr_Strategy[2])(_s,this,(ulong)local_20);
  }
  else {
    (*_s->_vptr_Strategy[4])(_s,this,(ulong)local_20);
  }
  return;
}

Assistant:

void SocketMonitor::processWrite(Strategy &strategy, socket_handle socket_fd) {
  socket_handle s = socket_fd;
  if (m_connectSockets.find(s) != m_connectSockets.end()) {
    m_connectSockets.erase(s);
    m_readSockets.insert(s);
    strategy.onConnect(*this, s);
  } else {
    strategy.onWrite(*this, s);
  }
}